

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_interface_linux.c
# Opt level: O3

os_interface * os_interface_linux_add(os_interface_listener *if_listener)

{
  list_entity *plVar1;
  uint32_t uVar2;
  os_interface *os_if;
  char *name;
  
  os_if = if_listener->data;
  if (os_if == (os_interface *)0x0) {
    name = if_listener->name;
    if ((name == (char *)0x0) || (*name == '\0')) {
      name = "any";
      if_listener->name = "any";
    }
    os_if = _add_interface(name);
    if (os_if == (os_interface *)0x0) {
      os_if = (os_interface *)0x0;
    }
    else {
      if_listener->data = os_if;
      plVar1 = (os_if->_listeners).prev;
      (if_listener->_node).next = &os_if->_listeners;
      (if_listener->_node).prev = plVar1;
      (os_if->_listeners).prev = &if_listener->_node;
      plVar1->next = &if_listener->_node;
      if ((if_listener->mesh == true) && (if_listener->name != "any")) {
        uVar2 = (os_if->_internal).mesh_counter;
        if ((uVar2 == 0) && (uVar2 = 0, (os_if->_internal).ignore_mesh == false)) {
          _init_mesh(os_if);
          uVar2 = (os_if->_internal).mesh_counter;
        }
        (os_if->_internal).mesh_counter = uVar2 + 1;
      }
      if_listener->_dirty = true;
      oonf_timer_start_ext(&os_if->_change_timer,200,200);
    }
  }
  return os_if;
}

Assistant:

struct os_interface *
os_interface_linux_add(struct os_interface_listener *if_listener) {
  struct os_interface *data;

  if (if_listener->data) {
    /* interface is already hooked up to data */
    return if_listener->data;
  }

  if (!if_listener->name || !if_listener->name[0]) {
    if_listener->name = _ANY_INTERFACE;
  }

  data = _add_interface(if_listener->name);
  if (!data) {
    return NULL;
  }

  /* hook into interface data */
  if_listener->data = data;
  list_add_tail(&data->_listeners, &if_listener->_node);

  if (if_listener->mesh && if_listener->name != _ANY_INTERFACE) {
    if (data->_internal.mesh_counter == 0 && !data->_internal.ignore_mesh) {
      _init_mesh(data);
    }
    data->_internal.mesh_counter++;
  }

  /* trigger interface change listener if necessary */
  if_listener->_dirty = true;
  oonf_timer_start(&data->_change_timer, 200);

  return data;
}